

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMPMultiplayer.cpp
# Opt level: O2

void XPMPRegisterPlaneNotifierFunc(XPMPPlaneNotifier_f inFunc,void *inRefcon)

{
  _List_iterator<XPMP2::XPMPPlaneNotifierTy> _Var1;
  XPMPPlaneNotifierTy observer;
  XPMPPlaneNotifierTy local_20;
  
  local_20.func = inFunc;
  local_20.refcon = inRefcon;
  _Var1 = std::
          __find_if<std::_List_iterator<XPMP2::XPMPPlaneNotifierTy>,__gnu_cxx::__ops::_Iter_equals_val<XPMP2::XPMPPlaneNotifierTy_const>>
                    (DAT_002cc4d0,&DAT_002cc4d0);
  if (_Var1._M_node == (_List_node_base *)&DAT_002cc4d0) {
    std::__cxx11::list<XPMP2::XPMPPlaneNotifierTy,_std::allocator<XPMP2::XPMPPlaneNotifierTy>_>::
    emplace_back<XPMP2::XPMPPlaneNotifierTy>
              ((list<XPMP2::XPMPPlaneNotifierTy,_std::allocator<XPMP2::XPMPPlaneNotifierTy>_> *)
               &DAT_002cc4d0,&local_20);
    if (XPMP2::glob < 1) {
      XPMP2::LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/XPMPMultiplayer.cpp"
                    ,0x223,"XPMPRegisterPlaneNotifierFunc",logDEBUG,"%lu observers registered",
                    DAT_002cc4e0);
    }
  }
  return;
}

Assistant:

void            XPMPRegisterPlaneNotifierFunc(XPMPPlaneNotifier_f       inFunc,
                                              void *                    inRefcon)
{
    // Avoid duplicate entries
    XPMPPlaneNotifierTy observer (inFunc, inRefcon);
    if (std::find(glob.listObservers.begin(),
                  glob.listObservers.end(),
                  observer) == glob.listObservers.end()) {
        glob.listObservers.emplace_back(std::move(observer));
        LOG_MSG(logDEBUG, "%lu observers registered",
                (unsigned long)glob.listObservers.size());
    }
}